

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_set_standard_lookup.c
# Opt level: O0

char * lookup_uname_helper(name_cache *cache,id_t id)

{
  long lVar1;
  archive *a;
  int iVar2;
  void *pvVar3;
  uint *puVar4;
  __uid_t in_ESI;
  undefined8 *in_RDI;
  int r;
  size_t nbuff_size;
  char *nbuff;
  passwd *result;
  passwd pwent;
  passwd *local_50;
  passwd local_48;
  __uid_t local_14;
  undefined8 *local_10;
  char *local_8;
  
  local_14 = in_ESI;
  local_10 = in_RDI;
  if (in_RDI[2] == 0) {
    in_RDI[2] = 0x100;
    pvVar3 = malloc(in_RDI[2]);
    local_10[1] = pvVar3;
  }
  if (local_10[1] == 0) {
    local_8 = (char *)0x0;
  }
  else {
    while( true ) {
      local_50 = &local_48;
      iVar2 = getpwuid_r(local_14,&local_48,(char *)local_10[1],local_10[2],&local_50);
      if ((iVar2 == 0) || (iVar2 != 0x22)) break;
      lVar1 = local_10[2];
      pvVar3 = realloc((void *)local_10[1],lVar1 << 1);
      if (pvVar3 == (void *)0x0) break;
      local_10[1] = pvVar3;
      local_10[2] = lVar1 << 1;
    }
    if (iVar2 == 0) {
      if (local_50 == (passwd *)0x0) {
        local_8 = (char *)0x0;
      }
      else {
        local_8 = strdup(local_50->pw_name);
      }
    }
    else {
      a = (archive *)*local_10;
      puVar4 = (uint *)__errno_location();
      archive_set_error(a,(int)(ulong)*puVar4,"Can\'t lookup user for id %d",(ulong)local_14);
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

static const char *
lookup_uname_helper(struct name_cache *cache, id_t id)
{
	struct passwd	pwent, *result;
	char * nbuff;
	size_t nbuff_size;
	int r;

	if (cache->buff_size == 0) {
		cache->buff_size = 256;
		cache->buff = malloc(cache->buff_size);
	}
	if (cache->buff == NULL)
		return (NULL);
	for (;;) {
		result = &pwent; /* Old getpwuid_r ignores last arg. */
		r = getpwuid_r((uid_t)id, &pwent,
			       cache->buff, cache->buff_size, &result);
		if (r == 0)
			break;
		if (r != ERANGE)
			break;
		/* ERANGE means our buffer was too small, but POSIX
		 * doesn't tell us how big the buffer should be, so
		 * we just double it and try again.  Because the buffer
		 * is kept around in the cache object, we shouldn't
		 * have to do this very often. */
		nbuff_size = cache->buff_size * 2;
		nbuff = realloc(cache->buff, nbuff_size);
		if (nbuff == NULL)
			break;
		cache->buff = nbuff;
		cache->buff_size = nbuff_size;
	}
	if (r != 0) {
		archive_set_error(cache->archive, errno,
		    "Can't lookup user for id %d", (int)id);
		return (NULL);
	}
	if (result == NULL)
		return (NULL);

	return strdup(result->pw_name);
}